

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

Prim * tinyusdz::tydra::GetParentPrim(Stage *stage,Path *path,string *err)

{
  bool bVar1;
  value_type *ppPVar2;
  undefined1 in_CL;
  string local_228;
  string local_208 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [36];
  undefined4 local_184;
  undefined1 local_180 [8];
  expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  Path parentPath;
  string local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [32];
  string *local_28;
  string *err_local;
  Path *path_local;
  Stage *stage_local;
  
  local_28 = err;
  err_local = &path->_prim_part;
  path_local = (Path *)stage;
  bVar1 = Path::is_valid(path);
  if (bVar1) {
    bVar1 = Path::is_root_path((Path *)err_local);
    if (bVar1) {
      if (local_28 != (string *)0x0) {
        ::std::__cxx11::string::operator=((string *)local_28,"Input Path is root(\"/\").\n");
      }
      stage_local = (Stage *)0x0;
    }
    else {
      bVar1 = Path::is_root_prim((Path *)err_local);
      if (bVar1) {
        if (local_28 != (string *)0x0) {
          ::std::__cxx11::string::operator=
                    ((string *)local_28,"Input Path is root Prim, so no parent Prim exists.\n");
        }
        stage_local = (Stage *)0x0;
      }
      else {
        bVar1 = Path::is_absolute_path((Path *)err_local);
        if (bVar1) {
          Path::get_parent_prim_path
                    ((Path *)&ret.contained.
                              super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .m_has_value,(Path *)err_local);
          Stage::GetPrimAtPath_abi_cxx11_
                    ((expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_180,(Stage *)path_local,
                     (Path *)&ret.contained.
                              super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_180);
          if (bVar1) {
            ppPVar2 = nonstd::expected_lite::
                      expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::value((expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_180);
            stage_local = (Stage *)*ppPVar2;
          }
          else {
            if (local_28 != (string *)0x0) {
              tinyusdz::to_string_abi_cxx11_
                        (&local_228,(tinyusdz *)err_local,(Path *)0x1,(bool)in_CL);
              ::std::operator+((char *)local_208,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               "Failed to get parent Prim from Path ");
              ::std::operator+(local_1e8,(char *)local_208);
              nonstd::expected_lite::
              expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::error((expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_180);
              ::std::operator+(local_1c8,local_1e8);
              ::std::operator+(local_1a8,(char *)local_1c8);
              ::std::__cxx11::string::operator+=((string *)local_28,(string *)local_1a8);
              ::std::__cxx11::string::~string((string *)local_1a8);
              ::std::__cxx11::string::~string((string *)local_1c8);
              ::std::__cxx11::string::~string((string *)local_1e8);
              ::std::__cxx11::string::~string(local_208);
              ::std::__cxx11::string::~string((string *)&local_228);
            }
            stage_local = (Stage *)0x0;
          }
          local_184 = 1;
          nonstd::expected_lite::
          expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_180);
          Path::~Path((Path *)&ret.contained.
                               super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               .m_has_value);
        }
        else {
          if (local_28 != (string *)0x0) {
            ::std::__cxx11::string::operator=
                      ((string *)local_28,
                       "Input Path must be absolute path(i.e. starts with \"/\").\n");
          }
          stage_local = (Stage *)0x0;
        }
      }
    }
  }
  else {
    if (local_28 != (string *)0x0) {
      tinyusdz::to_string_abi_cxx11_
                ((string *)&parentPath._valid,(tinyusdz *)err_local,(Path *)0x1,(bool)in_CL);
      ::std::operator+((char *)local_68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Input Path ");
      ::std::operator+(local_48,(char *)local_68);
      ::std::__cxx11::string::operator=((string *)local_28,(string *)local_48);
      ::std::__cxx11::string::~string((string *)local_48);
      ::std::__cxx11::string::~string(local_68);
      ::std::__cxx11::string::~string((string *)&parentPath._valid);
    }
    stage_local = (Stage *)0x0;
  }
  return (Prim *)stage_local;
}

Assistant:

const Prim *GetParentPrim(const tinyusdz::Stage &stage,
                          const tinyusdz::Path &path, std::string *err) {
  if (!path.is_valid()) {
    if (err) {
      (*err) = "Input Path " + tinyusdz::to_string(path) + " is invalid.\n";
    }
    return nullptr;
  }

  if (path.is_root_path()) {
    if (err) {
      (*err) = "Input Path is root(\"/\").\n";
    }
    return nullptr;
  }

  if (path.is_root_prim()) {
    if (err) {
      (*err) = "Input Path is root Prim, so no parent Prim exists.\n";
    }
    return nullptr;
  }

  if (!path.is_absolute_path()) {
    if (err) {
      (*err) = "Input Path must be absolute path(i.e. starts with \"/\").\n";
    }
    return nullptr;
  }

  tinyusdz::Path parentPath = path.get_parent_prim_path();

  nonstd::expected<const Prim *, std::string> ret =
      stage.GetPrimAtPath(parentPath);
  if (ret) {
    return ret.value();
  } else {
    if (err) {
      (*err) += "Failed to get parent Prim from Path " +
                tinyusdz::to_string(path) + ". Reason = " + ret.error() + "\n";
    }
    return nullptr;
  }
}